

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exereader.cpp
# Opt level: O0

uint64_t loader::exe_reader::get_file_version(istream *is)

{
  BinaryType BVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  long in_RDI;
  uint32_t file_version_ls;
  uint32_t file_version_ms;
  uint32_t magic;
  BinaryType bintype;
  bool found;
  istream *in_stack_00000038;
  undefined4 in_stack_ffffffffffffffdc;
  undefined1 local_11;
  undefined8 local_8;
  
  local_11 = false;
  BVar1 = anon_unknown_0::determine_binary_type(in_stack_00000038);
  if (BVar1 == VXDMagic) {
    local_11 = anon_unknown_0::le_reader::get_file_version(_file_version_ms);
  }
  else if (BVar1 == OS2Magic) {
    local_11 = anon_unknown_0::ne_reader::get_file_version
                         ((istream *)CONCAT44(in_stack_ffffffffffffffdc,0x454e));
  }
  else if (BVar1 == PEMagic) {
    local_11 = anon_unknown_0::pe_reader::get_file_version
                         ((istream *)CONCAT44(in_stack_ffffffffffffffdc,0x4550));
  }
  if (local_11 == false) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    uVar2 = util::load<unsigned_int>((istream *)0x168eab);
    uVar4 = std::ios::fail();
    if (((uVar4 & 1) == 0) && (uVar2 == 0xfeef04bd)) {
      std::istream::seekg(in_RDI,4);
      uVar2 = util::load<unsigned_int>((istream *)0x168ef7);
      uVar3 = util::load<unsigned_int>((istream *)0x168f05);
      uVar4 = std::ios::fail();
      if ((uVar4 & 1) == 0) {
        local_8 = CONCAT44(uVar2,uVar3);
      }
      else {
        local_8 = 0xffffffffffffffff;
      }
    }
    else {
      local_8 = 0xffffffffffffffff;
    }
  }
  return local_8;
}

Assistant:

boost::uint64_t exe_reader::get_file_version(std::istream & is) {
	
	bool found = false;
	BinaryType bintype = determine_binary_type(is);
	switch(bintype) {
		case OS2Magic: found = ne_reader::get_file_version(is); break;
		case VXDMagic: found = le_reader::get_file_version(is); break;
		case PEMagic:  found = pe_reader::get_file_version(is); break;
		default: break;
	}
	if(!found) {
		return FileVersionUnknown;
	}
	
	boost::uint32_t magic = util::load<boost::uint32_t>(is);
	if(is.fail() || magic != 0xfeef04bd) {
		return FileVersionUnknown;
	}
	
	is.seekg(4, std::ios_base::cur); // skip struct version
	boost::uint32_t file_version_ms = util::load<boost::uint32_t>(is);
	boost::uint32_t file_version_ls = util::load<boost::uint32_t>(is);
	if(is.fail()) {
		return FileVersionUnknown;
	}
	
	return (boost::uint64_t(file_version_ms) << 32) | boost::uint64_t(file_version_ls);
}